

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O1

bool __thiscall
Clasp::UncoreMinimize::Todo::shrinkNext(Todo *this,UncoreMinimize *self,ValueRep result)

{
  uint uVar1;
  bool bVar2;
  uint32 uVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  
  if (((uint)self->options_ & 0xe0) == 0xc0) {
    bVar2 = subsetNext(this,self,result);
    return bVar2;
  }
  if (result == '\x02') {
    this->next_ = this->last_;
    uVar3 = 0;
    lVar5 = 0x1c;
  }
  else {
    uVar3 = this->next_;
    lVar5 = 0x14;
  }
  *(uint32 *)((long)&(this->lits_).ebo_.buf + lVar5) = uVar3;
  uVar6 = (uint)self->options_ >> 5 & 7;
  uVar1 = (this->lits_).ebo_.size;
  if (uVar6 - 4 < 2) {
    uVar4 = this->step_;
    if (uVar4 != 0) {
      if (this->next_ + uVar4 < uVar1) {
        this->step_ = uVar4 * 2;
        goto LAB_0015502f;
      }
      if (uVar6 != 4) {
        uVar4 = uVar1 - this->next_ >> 1;
        goto LAB_0015502f;
      }
      this->step_ = 2;
LAB_0015502a:
      uVar4 = 1;
      goto LAB_0015502f;
    }
    uVar4 = (uint)(this->last_ == 0);
  }
  else if (uVar6 == 2) {
    uVar4 = ~this->next_ + uVar1;
  }
  else {
    if (uVar6 != 3) {
      this->step_ = 1;
      goto LAB_0015502a;
    }
    uVar4 = uVar1 - this->next_ >> 1;
  }
  this->step_ = uVar4;
LAB_0015502f:
  if (uVar4 != 0) {
    uVar4 = uVar4 + this->next_;
    this->next_ = uVar4;
    return uVar4 < uVar1;
  }
  return false;
}

Assistant:

bool UncoreMinimize::Todo::shrinkNext(UncoreMinimize& self, ValueRep result) {
	if (self.options_.trim == OptParams::usc_trim_min) {
		return subsetNext(self, result);
	}
	if (result == value_false) {
		next_ = last_;
		step_ = 0u;
	}
	else {
		last_ = next_;
	}
	const uint32 t  = self.options_.trim;
	const uint32 mx = size();
	uint32 s = step_;
	switch (t) {
		default:
		case OptParams::usc_trim_lin: step_ = s = 1;                break;
		case OptParams::usc_trim_inv: step_ = s = (mx - next_) - 1; break;
		case OptParams::usc_trim_bin: step_ = s = (mx - next_) / 2; break;
		case OptParams::usc_trim_rgs: // fallthrough
		case OptParams::usc_trim_exp:
			if      (s == 0u)                      { step_ = s = uint32(last_ == 0u); }
			else if ((next_ + s) < mx)             { step_ = s * 2; }
			else if (t == OptParams::usc_trim_rgs) { step_ = 2; s = 1; }
			else                                   { s = (mx - next_) / 2; }
			break;
	}
	return s && (next_ += s) < mx;
}